

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateCast(ExpressionTranslateContext *ctx,ExprTypeCast *expression)

{
  bool bVar1;
  TypeArray *pTVar2;
  TypeClass *pTVar3;
  TypeRef *pTVar4;
  TypeUnsizedArray *pTVar5;
  TypeUnsizedArray *typeUnsizedArray_1;
  TypeRef *typeRef_3;
  TypeClass *classType;
  TypeRef *typeRef_2;
  TypeArray *typeArray;
  TypeRef *typeRef_1;
  TypeUnsizedArray *typeUnsizedArray;
  TypeRef *typeRef;
  ExprTypeCast *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  switch(expression->category) {
  case EXPR_CAST_NUMERICAL:
    Print(ctx,"(");
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    Print(ctx,")(");
    Translate(ctx,expression->value);
    Print(ctx,")");
    break;
  case EXPR_CAST_PTR_TO_BOOL:
    Print(ctx,"(!!(");
    Translate(ctx,expression->value);
    Print(ctx,"))");
    break;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    Print(ctx,"((");
    Translate(ctx,expression->value);
    Print(ctx,").ptr != 0)");
    break;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    Print(ctx,"((");
    Translate(ctx,expression->value);
    Print(ctx,").id != 0)");
    break;
  case EXPR_CAST_NULL_TO_PTR:
    pTVar4 = getType<TypeRef>((expression->super_ExprBase).type);
    if (pTVar4 != (TypeRef *)0x0) {
      Print(ctx,"(");
      TranslateTypeName(ctx,pTVar4->subType);
      Print(ctx,"*)0");
    }
    break;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    Print(ctx,"__nullcMakeAutoRef(0, 0)");
    break;
  case EXPR_CAST_NULL_TO_UNSIZED:
    pTVar5 = getType<TypeUnsizedArray>((expression->super_ExprBase).type);
    if (pTVar5 != (TypeUnsizedArray *)0x0) {
      Print(ctx,"NULLCArray< ");
      TranslateTypeName(ctx,pTVar5->subType);
      Print(ctx," >()");
    }
    break;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    Print(ctx,"__makeAutoArray(0, NULLCArray<void>())");
    break;
  case EXPR_CAST_NULL_TO_FUNCTION:
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    Print(ctx,"()");
    break;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pTVar4 = getType<TypeRef>(expression->value->type);
    if (pTVar4 != (TypeRef *)0x0) {
      pTVar2 = getType<TypeArray>(pTVar4->subType);
      if (pTVar2 == (TypeArray *)0x0) {
        __assert_fail("typeArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x278,"void TranslateCast(ExpressionTranslateContext &, ExprTypeCast *)");
      }
      if ((pTVar2->length & 0xffffffffU) != pTVar2->length) {
        __assert_fail("unsigned(typeArray->length) == typeArray->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x279,"void TranslateCast(ExpressionTranslateContext &, ExprTypeCast *)");
      }
      Print(ctx,"__makeNullcArray< ");
      TranslateTypeName(ctx,pTVar2->subType);
      Print(ctx," >(");
      Translate(ctx,expression->value);
      Print(ctx,", %d)",pTVar2->length & 0xffffffff);
    }
    break;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pTVar4 = getType<TypeRef>(expression->value->type);
    if (pTVar4 != (TypeRef *)0x0) {
      pTVar3 = getType<TypeClass>(pTVar4->subType);
      if ((pTVar3 == (TypeClass *)0x0) ||
         (((pTVar3->extendable & 1U) == 0 && (pTVar3->baseClass == (TypeClass *)0x0)))) {
        Print(ctx,"__nullcMakeAutoRef(");
        Translate(ctx,expression->value);
        Print(ctx,", __nullcTR[%d])",(ulong)pTVar4->subType->typeIndex);
      }
      else {
        Print(ctx,"__nullcMakeExtendableAutoRef(");
        Translate(ctx,expression->value);
        Print(ctx,")");
      }
    }
    break;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pTVar4 = getType<TypeRef>((expression->super_ExprBase).type);
    if (pTVar4 != (TypeRef *)0x0) {
      Print(ctx,"(");
      TranslateTypeName(ctx,pTVar4->subType);
      Print(ctx,"*)__nullcGetAutoRef(");
      Translate(ctx,expression->value);
      Print(ctx,", __nullcTR[%d])",(ulong)pTVar4->subType->typeIndex);
    }
    break;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pTVar5 = getType<TypeUnsizedArray>(expression->value->type);
    if (pTVar5 != (TypeUnsizedArray *)0x0) {
      Print(ctx,"__makeAutoArray(__nullcTR[%d], ",(ulong)pTVar5->subType->typeIndex);
      Translate(ctx,expression->value);
      Print(ctx,")");
    }
    break;
  case EXPR_CAST_REINTERPRET:
    bVar1 = isType<TypeUnsizedArray>((expression->super_ExprBase).type);
    if ((bVar1) && (bVar1 = isType<TypeUnsizedArray>(expression->value->type), bVar1)) {
      Translate(ctx,expression->value);
    }
    else if (((expression->super_ExprBase).type == ctx->ctx->typeInt) &&
            (expression->value->type == ctx->ctx->typeTypeID)) {
      Print(ctx,"(int)(");
      Translate(ctx,expression->value);
      Print(ctx,")");
    }
    else {
      bVar1 = isType<TypeEnum>((expression->super_ExprBase).type);
      if ((bVar1) && (expression->value->type == ctx->ctx->typeInt)) {
        TranslateTypeName(ctx,(expression->super_ExprBase).type);
        Print(ctx,"(");
        Translate(ctx,expression->value);
        Print(ctx,")");
      }
      else if (((expression->super_ExprBase).type == ctx->ctx->typeInt) &&
              (bVar1 = isType<TypeEnum>(expression->value->type), bVar1)) {
        Translate(ctx,expression->value);
        Print(ctx,".value");
      }
      else {
        bVar1 = isType<TypeRef>((expression->super_ExprBase).type);
        if ((bVar1) && (bVar1 = isType<TypeRef>(expression->value->type), bVar1)) {
          Print(ctx,"(");
          TranslateTypeName(ctx,(expression->super_ExprBase).type);
          Print(ctx,")(");
          Translate(ctx,expression->value);
          Print(ctx,")");
        }
        else {
          bVar1 = isType<TypeFunction>((expression->super_ExprBase).type);
          if ((!bVar1) || (bVar1 = isType<TypeFunction>(expression->value->type), !bVar1)) {
            __assert_fail("!\"unknown cast\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                          ,0x2cf,"void TranslateCast(ExpressionTranslateContext &, ExprTypeCast *)")
            ;
          }
          TranslateTypeName(ctx,(expression->super_ExprBase).type);
          Print(ctx,"(");
          Translate(ctx,expression->value);
          Print(ctx,")");
        }
      }
    }
    break;
  default:
    __assert_fail("!\"unknown cast\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x2d3,"void TranslateCast(ExpressionTranslateContext &, ExprTypeCast *)");
  }
  return;
}

Assistant:

void TranslateCast(ExpressionTranslateContext &ctx, ExprTypeCast *expression)
{
	switch(expression->category)
	{
	case EXPR_CAST_NUMERICAL:
		Print(ctx, "(");
		TranslateTypeName(ctx, expression->type);
		Print(ctx, ")(");
		Translate(ctx, expression->value);
		Print(ctx, ")");
		break;
	case EXPR_CAST_PTR_TO_BOOL:
		Print(ctx, "(!!(");
		Translate(ctx, expression->value);
		Print(ctx, "))");
		break;
	case EXPR_CAST_UNSIZED_TO_BOOL:
		Print(ctx, "((");
		Translate(ctx, expression->value);
		Print(ctx, ").ptr != 0)");
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		Print(ctx, "((");
		Translate(ctx, expression->value);
		Print(ctx, ").id != 0)");
		break;
	case EXPR_CAST_NULL_TO_PTR:
		if(TypeRef *typeRef = getType<TypeRef>(expression->type))
		{
			Print(ctx, "(");
			TranslateTypeName(ctx, typeRef->subType);
			Print(ctx, "*)0");
		}
		break;
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		Print(ctx, "__nullcMakeAutoRef(0, 0)");
		break;
	case EXPR_CAST_NULL_TO_UNSIZED:
		if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(expression->type))
		{
			Print(ctx, "NULLCArray< ");
			TranslateTypeName(ctx, typeUnsizedArray->subType);
			Print(ctx, " >()");
		}
		break;
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		Print(ctx, "__makeAutoArray(0, NULLCArray<void>())");
		break;
	case EXPR_CAST_NULL_TO_FUNCTION:
		TranslateTypeName(ctx, expression->type);
		Print(ctx, "()");
		break;
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		if(TypeRef *typeRef = getType<TypeRef>(expression->value->type))
		{
			TypeArray *typeArray = getType<TypeArray>(typeRef->subType);

			assert(typeArray);
			assert(unsigned(typeArray->length) == typeArray->length);

			Print(ctx, "__makeNullcArray< ");
			TranslateTypeName(ctx, typeArray->subType);
			Print(ctx, " >(");
			Translate(ctx, expression->value);
			Print(ctx, ", %d)", (unsigned)typeArray->length);
		}
		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		if(TypeRef *typeRef = getType<TypeRef>(expression->value->type))
		{
			TypeClass *classType = getType<TypeClass>(typeRef->subType);

			if(classType && (classType->extendable || classType->baseClass))
			{
				Print(ctx, "__nullcMakeExtendableAutoRef(");
				Translate(ctx, expression->value);
				Print(ctx, ")");
			}
			else
			{
				Print(ctx, "__nullcMakeAutoRef(");
				Translate(ctx, expression->value);
				Print(ctx, ", __nullcTR[%d])", typeRef->subType->typeIndex);
			}
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		if(TypeRef *typeRef = getType<TypeRef>(expression->type))
		{
			Print(ctx, "(");
			TranslateTypeName(ctx, typeRef->subType);
			Print(ctx, "*)__nullcGetAutoRef(");
			Translate(ctx, expression->value);
			Print(ctx, ", __nullcTR[%d])", typeRef->subType->typeIndex);
		}
		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(expression->value->type))
		{
			Print(ctx, "__makeAutoArray(__nullcTR[%d], ", typeUnsizedArray->subType->typeIndex);
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		break;
	case EXPR_CAST_REINTERPRET:
		if(isType<TypeUnsizedArray>(expression->type) && isType<TypeUnsizedArray>(expression->value->type))
		{
			Translate(ctx, expression->value);
		}
		else if(expression->type == ctx.ctx.typeInt && expression->value->type == ctx.ctx.typeTypeID)
		{
			Print(ctx, "(int)(");
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		else if(isType<TypeEnum>(expression->type) && expression->value->type == ctx.ctx.typeInt)
		{
			TranslateTypeName(ctx, expression->type);
			Print(ctx, "(");
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		else if(expression->type == ctx.ctx.typeInt && isType<TypeEnum>(expression->value->type))
		{
			Translate(ctx, expression->value);
			Print(ctx, ".value");
		}
		else if(isType<TypeRef>(expression->type) && isType<TypeRef>(expression->value->type))
		{
			Print(ctx, "(");
			TranslateTypeName(ctx, expression->type);
			Print(ctx, ")(");
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		else if(isType<TypeFunction>(expression->type) && isType<TypeFunction>(expression->value->type))
		{
			TranslateTypeName(ctx, expression->type);
			Print(ctx, "(");
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		else
		{
			assert(!"unknown cast");
		}
		break;
	default:
		assert(!"unknown cast");
	}
}